

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O3

bool __thiscall
dxil_spv::CFGStructurizer::query_reachability_split_loop_header
          (CFGStructurizer *this,CFGNode *from,CFGNode *to,CFGNode *end_node)

{
  uint uVar1;
  bool bVar2;
  
  if (end_node->pred_back_edge != (CFGNode *)0x0) {
    if (from == end_node) {
      bVar2 = true;
      if (to == end_node) goto LAB_0013996d;
    }
    else {
      uVar1 = 1 << ((byte)end_node->forward_post_visit_order & 0x1f) &
              (this->reachability_bitset).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start
              [(ulong)(this->reachability_stride * from->forward_post_visit_order) +
               (ulong)(end_node->forward_post_visit_order >> 5)];
      bVar2 = uVar1 != 0;
      if (to == end_node) {
        if (uVar1 == 0) {
          return false;
        }
        goto LAB_0013996d;
      }
    }
    if ((bool)(((this->reachability_bitset).
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start
                [(ulong)(this->reachability_stride * to->forward_post_visit_order) +
                 (ulong)(end_node->forward_post_visit_order >> 5)] >>
                (end_node->forward_post_visit_order & 0x1f) & 1) != 0 ^ bVar2)) {
      return false;
    }
  }
LAB_0013996d:
  if (from != to) {
    return ((this->reachability_bitset).
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start
            [(ulong)(this->reachability_stride * from->forward_post_visit_order) +
             (ulong)(to->forward_post_visit_order >> 5)] >> (to->forward_post_visit_order & 0x1f) &
           1) != 0;
  }
  return true;
}

Assistant:

bool CFGStructurizer::query_reachability_split_loop_header(const CFGNode &from, const CFGNode &to, const CFGNode &end_node) const
{
	// A special query where from and to must lie on the same side of a loop header to be considered reachable.
	if (!end_node.pred_back_edge)
		return query_reachability(from, to);

	bool from_reaches_header = query_reachability(from, end_node);
	bool to_reaches_header = query_reachability(to, end_node);
	if (from_reaches_header != to_reaches_header)
		return false;

	return query_reachability(from, to);
}